

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O1

ParameterError file2memory(char **bufp,size_t *size,FILE *file)

{
  bool bVar1;
  CURLcode CVar2;
  size_t len;
  size_t sVar3;
  char *pcVar4;
  dynbuf dyn;
  char buffer [4096];
  dynbuf local_1058;
  undefined1 local_1038 [4104];
  
  if (file == (FILE *)0x0) {
    *size = 0;
    *bufp = (char *)0x0;
  }
  else {
    curlx_dyn_init(&local_1058,0x40000000);
    do {
      len = fread(local_1038,1,0x1000,(FILE *)file);
      if ((len == 0) || (CVar2 = curlx_dyn_addn(&local_1058,local_1038,len), CVar2 == CURLE_OK)) {
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      if (!bVar1) {
        return PARAM_NO_MEM;
      }
    } while (len != 0);
    sVar3 = curlx_dyn_len(&local_1058);
    *size = sVar3;
    pcVar4 = curlx_dyn_ptr(&local_1058);
    *bufp = pcVar4;
    if (!bVar1) {
      return PARAM_NO_MEM;
    }
  }
  return PARAM_OK;
}

Assistant:

ParameterError file2memory(char **bufp, size_t *size, FILE *file)
{
  if(file) {
    size_t nread;
    struct curlx_dynbuf dyn;
    curlx_dyn_init(&dyn, MAX_FILE2MEMORY);
    do {
      char buffer[4096];
      nread = fread(buffer, 1, sizeof(buffer), file);
      if(nread)
        if(curlx_dyn_addn(&dyn, buffer, nread))
          return PARAM_NO_MEM;
    } while(nread);
    *size = curlx_dyn_len(&dyn);
    *bufp = curlx_dyn_ptr(&dyn);
  }
  else {
    *size = 0;
    *bufp = NULL;
  }
  return PARAM_OK;
}